

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
ptc::Print<char>::
print_backend<std::ostream&,char_const(&)[8],char_const(&)[5],char_const(&)[8],int>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [8],
          char (*args) [5],char (*args_1) [8],int *args_2)

{
  size_type *psVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  char (*pacVar5) [8];
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  undefined8 uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  size_type *psVar12;
  ANSI local_4c;
  int *local_48;
  char (*local_40) [8];
  ANSI local_38 [2];
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar7 != 0) {
    uVar10 = std::__throw_system_error(iVar7);
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    _Unwind_Resume(uVar10);
  }
  local_4c = first;
  bVar6 = is_escape<char[8]>(first,&local_4c);
  local_48 = args_2;
  local_40 = first;
  if ((bVar6) || (sVar2 = (this->pattern)._M_string_length, sVar2 == 0)) {
    sVar9 = strlen(*first);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*first,sVar9);
  }
  else {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar2);
    pacVar5 = local_40;
    sVar9 = strlen(*local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,*pacVar5,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
  }
  local_4c = first;
  bVar6 = is_escape<char[8]>(local_40,&local_4c);
  pbVar11 = &this->pattern;
  psVar12 = &(this->pattern)._M_string_length;
  sVar2 = (this->pattern)._M_string_length;
  if (bVar6) {
    if (sVar2 == 0) {
      sVar9 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*args,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      sVar9 = strlen(*args_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,*args_1,sVar9);
      pbVar11 = &this->sep;
      psVar12 = &(this->sep)._M_string_length;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,(pbVar11->_M_dataplus)._M_p,*psVar12);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)os,*local_48);
    }
    else {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar11->_M_dataplus)._M_p,sVar2);
      sVar9 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args,sVar9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar11->_M_dataplus)._M_p,*psVar12);
      sVar9 = strlen(*args_1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args_1,sVar9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      psVar1 = &(this->sep)._M_string_length;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this->sep)._M_dataplus._M_p,*psVar1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(pbVar11->_M_dataplus)._M_p,*psVar12);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_48);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      pbVar11 = &this->sep;
      psVar12 = psVar1;
    }
LAB_0010a36c:
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
  }
  else {
    pcVar3 = (this->sep)._M_dataplus._M_p;
    sVar4 = (this->sep)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar3,sVar4);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      sVar9 = strlen(*args);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      sVar9 = strlen(*args_1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args_1,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pbVar11->_M_dataplus)._M_p,*psVar12);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*local_48);
      goto LAB_0010a36c;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar3,sVar4);
    sVar9 = strlen(*args);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args,sVar9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    sVar9 = strlen(*args_1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,*args_1,sVar9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
    std::ostream::operator<<(poVar8,*local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
  local_4c = generic;
  bVar6 = is_escape<char[8]>(local_40,&local_4c);
  if (!bVar6) {
    local_38[1] = 1;
    bVar6 = is_escape<char[5]>(args,local_38 + 1);
    if (!bVar6) {
      local_38[0] = generic;
      bVar6 = is_escape<char[8]>(args_1,local_38);
      if (!bVar6) goto LAB_0010a3e9;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\x1b[0m",4);
LAB_0010a3e9:
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }